

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

strbuf * rsa1_save_sb(RSAKey *key,char *passphrase)

{
  uchar val;
  strbuf *psVar1;
  char *str;
  ptrlen pVar2;
  undefined1 local_38 [8];
  uchar keybuf [16];
  uint8_t bytes [2];
  int estart;
  strbuf *buf;
  char *passphrase_local;
  RSAKey *key_local;
  
  psVar1 = strbuf_new_nm();
  pVar2.len = 0x21;
  pVar2.ptr = "SSH PRIVATE KEY FILE FORMAT 1.1\n";
  BinarySink_put_datapl(psVar1->binarysink_,pVar2);
  val = '\0';
  if (passphrase != (char *)0x0) {
    val = '\x03';
  }
  BinarySink_put_byte(psVar1->binarysink_,val);
  BinarySink_put_uint32(psVar1->binarysink_,0);
  rsa_ssh1_public_blob(psVar1->binarysink_,key,RSA_SSH1_MODULUS_FIRST);
  str = NULLTOEMPTY(key->comment);
  BinarySink_put_stringz(psVar1->binarysink_,str);
  keybuf._12_4_ = (undefined4)psVar1->len;
  random_read(keybuf + 10,2);
  BinarySink_put_data(psVar1->binarysink_,keybuf + 10,2);
  BinarySink_put_data(psVar1->binarysink_,keybuf + 10,2);
  BinarySink_put_mp_ssh1(psVar1->binarysink_,key->private_exponent);
  BinarySink_put_mp_ssh1(psVar1->binarysink_,key->iqmp);
  BinarySink_put_mp_ssh1(psVar1->binarysink_,key->q);
  BinarySink_put_mp_ssh1(psVar1->binarysink_,key->p);
  BinarySink_put_padding(psVar1->binarysink_,(long)(int)keybuf._12_4_ - psVar1->len & 7,'\0');
  if (passphrase != (char *)0x0) {
    pVar2 = ptrlen_from_asciz(passphrase);
    hash_simple(&ssh_md5,pVar2,local_38);
    des3_encrypt_pubkey(local_38,psVar1->u + (int)keybuf._12_4_,(int)psVar1->len - keybuf._12_4_);
    smemclr(local_38,0x10);
  }
  return psVar1;
}

Assistant:

strbuf *rsa1_save_sb(RSAKey *key, const char *passphrase)
{
    strbuf *buf = strbuf_new_nm();
    int estart;

    /*
     * The public part of the key.
     */
    put_datapl(buf, rsa1_signature);
    put_byte(buf, passphrase ? SSH1_CIPHER_3DES : 0); /* encryption type */
    put_uint32(buf, 0);                              /* reserved */
    rsa_ssh1_public_blob(BinarySink_UPCAST(buf), key,
                         RSA_SSH1_MODULUS_FIRST);
    put_stringz(buf, NULLTOEMPTY(key->comment));

    /*
     * The encrypted portion starts here.
     */
    estart = buf->len;

    /*
     * Two bytes, then the same two bytes repeated.
     */
    {
        uint8_t bytes[2];
        random_read(bytes, 2);
        put_data(buf, bytes, 2);
        put_data(buf, bytes, 2);
    }

    /*
     * Four more bignums: the decryption exponent, then iqmp, then
     * q, then p.
     */
    put_mp_ssh1(buf, key->private_exponent);
    put_mp_ssh1(buf, key->iqmp);
    put_mp_ssh1(buf, key->q);
    put_mp_ssh1(buf, key->p);

    /*
     * Now write zeros until the encrypted portion is a multiple of
     * 8 bytes.
     */
    put_padding(buf, (estart - buf->len) & 7, 0);

    /*
     * Now encrypt the encrypted portion.
     */
    if (passphrase) {
        unsigned char keybuf[16];

        hash_simple(&ssh_md5, ptrlen_from_asciz(passphrase), keybuf);
        des3_encrypt_pubkey(keybuf, buf->u + estart, buf->len - estart);
        smemclr(keybuf, sizeof(keybuf));        /* burn the evidence */
    }

    return buf;
}